

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall vkt::sr::ShaderEvalContext::reset(ShaderEvalContext *this,float sx,float sy)

{
  ulong uVar1;
  ulong uVar2;
  Vec4 *pVVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  int local_38;
  int iStack_34;
  int iStack_30;
  float fStack_2c;
  
  (this->color).m_data[0] = 0.0;
  (this->color).m_data[1] = 0.0;
  (this->color).m_data[2] = 0.0;
  (this->color).m_data[3] = 1.0;
  this->isDiscarded = false;
  fVar5 = sx + sx + -1.0;
  fVar6 = sy + sy + -1.0;
  (this->coords).m_data[0] = fVar5;
  (this->coords).m_data[1] = fVar6;
  (this->coords).m_data[2] = fVar6 * 0.33 - fVar5;
  (this->coords).m_data[3] = fVar5 * -0.275 - fVar6;
  (this->unitCoords).m_data[0] = sx;
  (this->unitCoords).m_data[1] = sy;
  *(ulong *)((this->unitCoords).m_data + 2) = CONCAT44(sx * 0.5 + sy * 0.25,sx * 0.33 + sy * 0.5);
  uVar1 = (ulong)((long)(this->m_quadGrid->m_userAttribTransforms).
                        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_quadGrid->m_userAttribTransforms).
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 6;
  pVVar3 = this->in;
  uVar4 = 0;
  uVar2 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    QuadGrid::getUserAttrib((QuadGrid *)&stack0xffffffffffffffc8,(int)this->m_quadGrid,sx,sy);
    pVVar3->m_data[0] = (float)local_38;
    pVVar3->m_data[1] = (float)iStack_34;
    pVVar3->m_data[2] = (float)iStack_30;
    pVVar3->m_data[3] = fStack_2c;
    pVVar3 = pVVar3 + 1;
  }
  return;
}

Assistant:

void ShaderEvalContext::reset (float sx, float sy)
{
	// Clear old values
	color		= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	isDiscarded	= false;

	// Compute coords
	coords		= m_quadGrid.getCoords(sx, sy);
	unitCoords	= m_quadGrid.getUnitCoords(sx, sy);

	// Compute user attributes.
	const int numAttribs = m_quadGrid.getNumUserAttribs();
	DE_ASSERT(numAttribs <= MAX_USER_ATTRIBS);
	for (int attribNdx = 0; attribNdx < numAttribs; attribNdx++)
		in[attribNdx] = m_quadGrid.getUserAttrib(attribNdx, sx, sy);
}